

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O0

void fiber_fn(sx_fiber_transfer transfer)

{
  code *pcVar1;
  long *plVar2;
  void *user;
  sx_fiber_t to;
  sx__job_thread_data *tdata;
  sx_job_context *ctx;
  sx__job *job;
  sx_fiber_transfer transfer_local;
  
  user = transfer.user;
  to = transfer.from;
  plVar2 = (long *)sx_tls_get(*(sx_tls *)(*(long *)((long)user + 0x40) + 200));
  if ((void *)*plVar2 != user) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x65,"tdata->cur_job == job");
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  *(sx_fiber_t *)((long)user + 0x28) = to;
  plVar2[3] = (long)to;
  *plVar2 = (long)user;
  (**(code **)((long)user + 0x48))
            (*(undefined4 *)((long)user + 0x58),*(undefined4 *)((long)user + 0x5c),(int)plVar2[4],
             *(undefined8 *)((long)user + 0x50));
  *(undefined4 *)((long)user + 4) = 1;
  sx_fiber_switch(to,user);
  return;
}

Assistant:

static void fiber_fn(sx_fiber_transfer transfer)
{
    sx__job* job = (sx__job*)transfer.user;
    sx_job_context* ctx = job->ctx;
    sx__job_thread_data* tdata = (sx__job_thread_data*)sx_tls_get(ctx->thread_tls);

    sx_assert(tdata->cur_job == job);

    job->selector_fiber = transfer.from;
    tdata->selector_fiber = transfer.from;
    tdata->cur_job = job;

    // Run the actual job code
    job->callback(job->range_start, job->range_end, tdata->thread_index, job->user);
    job->done = 1;

    // Back to job caller
    sx_fiber_switch(transfer.from, transfer.user);
}